

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::logColor
          (SRGBTestCase *this,string *colorLogMessage,int colorIdx,Vec4 *color)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  ostream *poVar2;
  ostringstream message;
  string local_340 [32];
  ostringstream local_320 [376];
  undefined1 local_1a8 [384];
  
  pTVar1 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar2 = std::operator<<((ostream *)local_320,(string *)colorLogMessage);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,colorIdx);
  poVar2 = std::operator<<(poVar2," = (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,color->m_data[0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,color->m_data[1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,color->m_data[2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,color->m_data[3]);
  std::operator<<(poVar2,")");
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,local_340);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  return;
}

Assistant:

void SRGBTestCase::logColor (const std::string& colorLogMessage, int colorIdx, tcu::Vec4 color) const
{
	tcu::TestLog&			log		= m_context.getTestContext().getLog();
	std::ostringstream		message;

	message << colorLogMessage << colorIdx << " = (" << color.x() << ", " << color.y() << ", " << color.z() << ", " << color.w() << ")";
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}